

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O1

void grasshopper_set_encrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  uint *puVar1;
  byte bVar2;
  uint64_t uVar3;
  byte bVar4;
  int i;
  undefined8 *puVar5;
  byte bVar6;
  uint j;
  int iVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  byte bStack_69;
  undefined4 local_68;
  uint32_t uStack_64;
  uint uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  grasshopper_w128_t z;
  grasshopper_w128_t c;
  
  uVar16 = (key->k).d[0];
  uVar17 = (key->k).d[1];
  uVar18 = (key->k).d[2];
  uVar19 = (key->k).d[3];
  uVar3 = (key->k).q[1];
  uVar12 = (key->k).d[4];
  uVar13 = (key->k).d[5];
  uVar14 = (key->k).d[6];
  uVar15 = (key->k).d[7];
  subkeys->k[0].q[0] = (key->k).q[0];
  subkeys->k[0].q[1] = uVar3;
  subkeys->k[1].d[0] = uVar12;
  *(uint32_t *)((long)subkeys->k + 0x14) = uVar13;
  *(uint32_t *)((long)subkeys->k + 0x18) = uVar14;
  *(uint32_t *)((long)subkeys->k + 0x1c) = uVar15;
  bVar6 = 1;
  lVar8 = 0;
  do {
    uVar11 = lVar8 * 4 + 4U & 0xfffffffffffffff0;
    puVar5 = (undefined8 *)((long)subkeys->k + uVar11);
    local_58 = 0;
    uStack_50 = (ulong)bVar6 << 0x38;
    iVar7 = 0;
    do {
      lVar9 = 0xf;
      bVar10 = uStack_50._7_1_;
      do {
        bVar2 = *(byte *)((long)&uStack_5c + lVar9 + 3);
        bVar4 = 0;
        *(byte *)((long)&local_58 + lVar9) = bVar2;
        if (((ulong)bVar2 != 0) && (grasshopper_pi_inv[lVar9 + 0xff] != 0)) {
          bVar4 = grasshopper_galois_alpha_to
                  [(ulong)((uint)grasshopper_galois_index_of[grasshopper_pi_inv[lVar9 + 0xff]] +
                          (uint)grasshopper_galois_index_of[bVar2]) % 0xff];
        }
        bVar10 = bVar10 ^ bVar4;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      local_58 = (ulong)bVar10;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x10);
    local_58._0_4_ = (uint)bVar10;
    local_68 = (uint)local_58 ^ uVar16;
    uStack_64 = uVar17;
    uStack_60 = (uint)uStack_50 ^ uVar18;
    uStack_5c = uStack_50._4_4_ ^ uVar19;
    lVar9 = 0;
    do {
      *(uint8_t *)((long)&local_68 + lVar9) = grasshopper_pi[*(byte *)((long)&local_68 + lVar9)];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
    iVar7 = 0;
    do {
      lVar9 = 0xf;
      bVar10 = uStack_5c._3_1_;
      do {
        bVar2 = (&bStack_69)[lVar9];
        bVar4 = 0;
        *(byte *)((long)&local_68 + lVar9) = bVar2;
        if (((ulong)bVar2 != 0) && (grasshopper_pi_inv[lVar9 + 0xff] != 0)) {
          bVar4 = grasshopper_galois_alpha_to
                  [(ulong)((uint)grasshopper_galois_index_of[grasshopper_pi_inv[lVar9 + 0xff]] +
                          (uint)grasshopper_galois_index_of[bVar2]) % 0xff];
        }
        bVar10 = bVar10 ^ bVar4;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      local_68 = CONCAT31(local_68._1_3_,bVar10);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x10);
    local_68 = uVar12 ^ local_68;
    uStack_64 = uVar13 ^ uStack_64;
    uStack_60 = uVar14 ^ uStack_60;
    uStack_5c = uVar15 ^ uStack_5c;
    if ((bVar6 & 7) == 0) {
      *puVar5 = CONCAT44(uStack_64,local_68);
      puVar5[1] = CONCAT44(uStack_5c,uStack_60);
      puVar1 = (uint *)((long)subkeys->k + uVar11 + 0x10);
      *puVar1 = uVar16;
      puVar1[1] = uVar17;
      puVar1[2] = uVar18;
      puVar1[3] = uVar19;
    }
    bVar6 = bVar6 + 1;
    lVar8 = lVar8 + 1;
    uVar12 = uVar16;
    uVar13 = uVar17;
    uVar14 = uVar18;
    uVar15 = uVar19;
    uVar16 = local_68;
    uVar17 = uStack_64;
    uVar18 = uStack_60;
    uVar19 = uStack_5c;
  } while (lVar8 != 0x20);
  return;
}

Assistant:

void grasshopper_set_encrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
    grasshopper_w128_t c, x, y, z;
    int i;

    for (i = 0; i < 16; i++) {
        // this will be have to changed for little-endian systems
        x.b[i] = key->k.b[i];
        y.b[i] = key->k.b[i + 16];
    }

    grasshopper_copy128(&subkeys->k[0], &x);
    grasshopper_copy128(&subkeys->k[1], &y);

    for (i = 1; i <= 32; i++) {

        // C Value
        grasshopper_zero128(&c);
        c.b[15] = (uint8_t) i;        // load round in lsb
        grasshopper_l(&c);

        grasshopper_plus128(&z, &x, &c);
        grasshopper_convert128(&z, grasshopper_pi);
        grasshopper_l(&z);
        grasshopper_append128(&z, &y);

        grasshopper_copy128(&y, &x);
        grasshopper_copy128(&x, &z);

        if ((i & 7) == 0) {
            int k = i >> 2;
            grasshopper_copy128(&subkeys->k[k], &x);
            grasshopper_copy128(&subkeys->k[k + 1], &y);
        }
    }

    // security++
    grasshopper_zero128(&c);
    grasshopper_zero128(&x);
    grasshopper_zero128(&y);
    grasshopper_zero128(&z);
}